

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::ByteSizeLong(BorderAmounts_EdgeSizes *this)

{
  int iVar1;
  uint64 uVar2;
  size_t sVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  BorderAmounts_EdgeSizes *this_local;
  
  sStack_18 = 0;
  uVar2 = startedgesize(this);
  if (uVar2 != 0) {
    uVar2 = startedgesize(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sStack_18 + 1;
  }
  uVar2 = endedgesize(this);
  if (uVar2 != 0) {
    uVar2 = endedgesize(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t BorderAmounts_EdgeSizes::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  size_t total_size = 0;

  // uint64 startEdgeSize = 1;
  if (this->startedgesize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->startedgesize());
  }

  // uint64 endEdgeSize = 2;
  if (this->endedgesize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->endedgesize());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}